

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::
ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
CallOut(ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,ChArchiveOut *marchive)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *auto_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  char in_R9B;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  auto_name = this->_ptr_to_val;
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::__cxx11::string::c_str();
  make_ChNameValue<std::__cxx11::string>
            (&local_30,(chrono *)"*this->_ptr_to_val",(char *)auto_name,t,(char *)0x0,in_R9B);
  (*(marchive->super_ChArchive)._vptr_ChArchive[8])(marchive,&local_30);
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~ChNameValue(&local_30);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}